

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantum.cpp
# Opt level: O0

void __thiscall quantum::QuantumComputer::resetState(QuantumComputer *this)

{
  bool bVar1;
  reference pdVar2;
  reference pvVar3;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_28;
  double *local_20;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_18;
  iterator it;
  QuantumComputer *this_local;
  
  it._M_current = (double *)this;
  __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
  __normal_iterator(&local_18);
  local_20 = (double *)std::vector<double,_std::allocator<double>_>::begin(&this->baseVector);
  local_18._M_current = local_20;
  while( true ) {
    local_28._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::end(&this->baseVector);
    bVar1 = __gnu_cxx::operator<(&local_18,&local_28);
    if (!bVar1) break;
    pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_18);
    *pdVar2 = 0.0;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_18,0);
  }
  pvVar3 = std::vector<double,_std::allocator<double>_>::at(&this->baseVector,0);
  *pvVar3 = 1.0;
  return;
}

Assistant:

void quantum::QuantumComputer::resetState() {
    std::vector<double>::iterator it;
    for (it = this->baseVector.begin(); it < this->baseVector.end(); it++) {
        *it = 0.0;
    }
    this->baseVector.at(0) = 1;
}